

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O3

void setlock(int argc,char **argv)

{
  char **ppcVar1;
  char *f;
  int iVar2;
  uint x;
  uint d;
  
  iVar2 = sgetoptmine(argc,argv,"nNxX");
  d = 0;
  x = 0;
  if (iVar2 != subgetoptdone) {
    x = 0;
    d = 0;
    do {
      if (iVar2 < 0x6e) {
        if (iVar2 == 0x4e) {
          d = 0;
        }
        else if (iVar2 == 0x58) {
          x = 0;
        }
        else {
LAB_00104b4e:
          strerr_die(100,"usage: ",progname," [ -nNxX ] file program [ arg ... ]","\n",(char *)0x0,
                     (char *)0x0,(strerr *)0x0);
        }
      }
      else if (iVar2 == 0x6e) {
        d = 1;
      }
      else {
        if (iVar2 != 0x78) goto LAB_00104b4e;
        x = 1;
      }
      iVar2 = sgetoptmine(argc,argv,"nNxX");
    } while (iVar2 != subgetoptdone);
  }
  ppcVar1 = argv + subgetoptind;
  f = *ppcVar1;
  if (f == (char *)0x0) {
    strerr_die(100,"usage: ",progname," [ -nNxX ] file program [ arg ... ]","\n",(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  if (ppcVar1[1] == (char *)0x0) {
    strerr_die(100,"usage: ",progname," [ -nNxX ] file program [ arg ... ]","\n",(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  slock(f,d,x);
  pathexec(ppcVar1 + 1);
  if (x == 0) {
    strerr_die(0x6f,"chpst: fatal: ","unable to run",": ",ppcVar1[1],": ",(char *)0x0,&strerr_sys);
  }
  _exit(0);
}

Assistant:

void setlock(int argc, const char *const *argv) {
  int opt;
  unsigned int delay =0;
  unsigned int x =0;
  const char *fn;

  while ((opt =getopt(argc, argv, "nNxX")) != opteof)
    switch(opt) {
      case 'n': delay =1; break;
      case 'N': delay =0; break;
      case 'x': x =1; break;
      case 'X': x =0; break;
      default: setlock_usage();
    }
  argv +=optind;
  if (! (fn =*argv)) setlock_usage();
  if (! *++argv) setlock_usage();

  slock(fn, delay, x);
  pathexec(argv);
  if (! x) fatal2("unable to run", *argv);
  _exit(0);
}